

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O2

void __thiscall duel::printField(duel *this)

{
  stack<card,_std::deque<card,_std::allocator<card>_>_> *psVar1;
  hand *phVar2;
  field *pfVar3;
  uint uVar4;
  long lVar5;
  duel *pdVar6;
  ostream *poVar7;
  size_type sVar8;
  string local_80;
  duel *local_60;
  string local_58;
  stack<card,_std::deque<card,_std::allocator<card>_>_> *local_38;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"[");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x32;
  poVar7 = std::operator<<(poVar7,"player 2");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x32;
  poVar7 = std::operator<<(poVar7,"]");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"| deck");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x5f;
  poVar7 = std::operator<<(poVar7,"|");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"| [");
  psVar1 = &this->deck;
  local_60 = this;
  std::deque<card,_std::allocator<card>_>::size(&psVar1->c);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,"]");
  sVar8 = std::deque<card,_std::allocator<card>_>::size(&psVar1->c);
  std::__cxx11::to_string(&local_80,sVar8 >> 1);
  *(long *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) =
       (long)(0x61 - (int)local_80._M_string_length);
  poVar7 = std::operator<<(poVar7,"|");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&local_80);
  poVar7 = std::operator<<((ostream *)&std::cout,"| hand");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x5f;
  poVar7 = std::operator<<(poVar7,"|");
  std::endl<char,std::char_traits<char>>(poVar7);
  pdVar6 = local_60;
  uVar4 = local_60->player;
  poVar7 = std::operator<<((ostream *)&std::cout,"| ");
  phVar2 = &pdVar6->hand2;
  if (uVar4 == 2) {
    hand::printHand_abi_cxx11_(&local_80,phVar2);
    poVar7 = std::operator<<(poVar7,(string *)&local_80);
    hand::printHand_abi_cxx11_(&local_58,phVar2);
    *(long *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) =
         (long)(0x6300000000 - (local_58._M_string_length << 0x20)) >> 0x20;
    poVar7 = std::operator<<(poVar7,"|");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    hand::printHidden_abi_cxx11_(&local_80,phVar2);
    poVar7 = std::operator<<(poVar7,(string *)&local_80);
    hand::printHidden_abi_cxx11_(&local_58,phVar2);
    *(long *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) =
         (long)(0x6300000000 - (local_58._M_string_length << 0x20)) >> 0x20;
    poVar7 = std::operator<<(poVar7,"|");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  poVar7 = std::operator<<((ostream *)&std::cout,"| pile");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x5f;
  poVar7 = std::operator<<(poVar7,"|");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"| ");
  pfVar3 = &local_60->field2;
  field::printPile_abi_cxx11_(&local_80,pfVar3);
  poVar7 = std::operator<<(poVar7,(string *)&local_80);
  field::printPile_abi_cxx11_(&local_58,pfVar3);
  *(long *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) =
       (long)(0x6300000000 - (local_58._M_string_length << 0x20)) >> 0x20;
  poVar7 = std::operator<<(poVar7,"|");
  std::endl<char,std::char_traits<char>>(poVar7);
  local_38 = psVar1;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  poVar7 = std::operator<<((ostream *)&std::cout,"| score");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x5e;
  poVar7 = std::operator<<(poVar7,"|");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"| ");
  poVar7 = std::operator<<(poVar7,"{");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,"}");
  std::__cxx11::to_string(&local_80,pfVar3->pile);
  *(long *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) =
       0x6100000000 -
       (CONCAT44(local_80._M_string_length._4_4_,(int)local_80._M_string_length) << 0x20) >> 0x20;
  poVar7 = std::operator<<(poVar7,"|");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&local_80);
  lVar5 = *(long *)(std::cout + -0x18);
  pfVar3 = &local_60->field1;
  std::__cxx11::to_string(&local_80,(local_60->field1).pile);
  *(long *)(std::__cxx11::string::string + lVar5) =
       0x61 - CONCAT44(local_80._M_string_length._4_4_,(int)local_80._M_string_length);
  std::__cxx11::string::~string((string *)&local_80);
  *(uint *)(strtol + *(long *)(std::cout + -0x18)) =
       *(uint *)(strtol + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  poVar7 = std::operator<<(poVar7,"{");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,"} |");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 100;
  poVar7 = std::operator<<(poVar7,"score |");
  std::endl<char,std::char_traits<char>>(poVar7);
  lVar5 = *(long *)(std::cout + -0x18);
  field::printPile_abi_cxx11_(&local_80,pfVar3);
  *(long *)(std::__cxx11::string::string + lVar5) =
       99 - CONCAT44(local_80._M_string_length._4_4_,(int)local_80._M_string_length);
  std::__cxx11::string::~string((string *)&local_80);
  *(uint *)(strtol + *(long *)(std::cout + -0x18)) =
       *(uint *)(strtol + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  field::printPile_abi_cxx11_(&local_80,pfVar3);
  poVar7 = std::operator<<(poVar7,(string *)&local_80);
  poVar7 = std::operator<<(poVar7," |");
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&local_80);
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 100;
  poVar7 = std::operator<<(poVar7,"pile |");
  std::endl<char,std::char_traits<char>>(poVar7);
  phVar2 = &local_60->hand1;
  lVar5 = *(long *)(std::cout + -0x18);
  if (local_60->player == 1) {
    hand::printHand_abi_cxx11_(&local_80,phVar2);
    *(long *)(std::__cxx11::string::string + lVar5) =
         99 - CONCAT44(local_80._M_string_length._4_4_,(int)local_80._M_string_length);
    std::__cxx11::string::~string((string *)&local_80);
    *(uint *)(strtol + *(long *)(std::cout + -0x18)) =
         *(uint *)(strtol + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    poVar7 = std::operator<<((ostream *)&std::cout,"|");
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    hand::printHand_abi_cxx11_(&local_80,phVar2);
    poVar7 = std::operator<<(poVar7,(string *)&local_80);
    poVar7 = std::operator<<(poVar7," |");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    hand::printHidden_abi_cxx11_(&local_80,phVar2);
    *(long *)(std::__cxx11::string::string + lVar5) =
         99 - CONCAT44(local_80._M_string_length._4_4_,(int)local_80._M_string_length);
    std::__cxx11::string::~string((string *)&local_80);
    *(uint *)(strtol + *(long *)(std::cout + -0x18)) =
         *(uint *)(strtol + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
    poVar7 = std::operator<<((ostream *)&std::cout,"|");
    *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
         *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    hand::printHidden_abi_cxx11_(&local_80,phVar2);
    poVar7 = std::operator<<(poVar7,(string *)&local_80);
    poVar7 = std::operator<<(poVar7," |");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&local_80);
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 100;
  poVar7 = std::operator<<(poVar7,"hand |");
  std::endl<char,std::char_traits<char>>(poVar7);
  psVar1 = local_38;
  lVar5 = *(long *)(std::cout + -0x18);
  sVar8 = std::deque<card,_std::allocator<card>_>::size(&local_38->c);
  std::__cxx11::to_string(&local_80,sVar8 >> 1);
  *(long *)(std::__cxx11::string::string + lVar5) =
       0x61 - CONCAT44(local_80._M_string_length._4_4_,(int)local_80._M_string_length);
  std::__cxx11::string::~string((string *)&local_80);
  *(uint *)(strtol + *(long *)(std::cout + -0x18)) =
       *(uint *)(strtol + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
       *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffff4f | 0x80;
  poVar7 = std::operator<<(poVar7,"[");
  std::deque<card,_std::allocator<card>_>::size(&psVar1->c);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7,"] |");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"|");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 100;
  poVar7 = std::operator<<(poVar7,"deck |");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"[");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x32;
  poVar7 = std::operator<<(poVar7,"player 1");
  *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x32;
  poVar7 = std::operator<<(poVar7,"]");
  std::endl<char,std::char_traits<char>>(poVar7);
  return;
}

Assistant:

void duel::printField() {
    cout << "[" << setw(50) << "player 2" << setw(50) << "]" << endl;
    cout << "| deck" << setw(95) << "|" << endl;
    cout << "| [" << deck.size()/2 << "]" << setw(97-to_string(deck.size()/2).size()) << "|" << endl;
    cout << "| hand" << setw(95) << "|" << endl;
    if(player == 2) cout << "| " << hand2.printHand() << setw(99-hand2.printHand().size()) << "|" << endl;
    else cout << "| " << hand2.printHidden() << setw(99-hand2.printHidden().size()) << "|" << endl;
    cout << "| pile" << setw(95) << "|" << endl;
    cout << "| " << field2.printPile() << setw(99-field2.printPile().size()) << "|" << endl;
    cout << "| score" << setw(94) << "|" << endl;
    cout << "| " << "{" << field2.getPile() << "}" << setw(97-to_string(field2.getPile()).size()) << "|" << endl;
    cout.width(97-to_string(field1.getPile()).size()); cout << left << "|" << right << "{" << field1.getPile() << "} |" << endl;
    cout << "|" << setw(100) << "score |" << endl;
    cout.width(99-field1.printPile().size()); cout << left << "|" << right << field1.printPile() << " |" << endl;
    cout << "|" << setw(100) << "pile |" << endl;
    if(player == 1) {
        cout.width(99-hand1.printHand().size()); cout << left << "|" << right << hand1.printHand() << " |" << endl;
    }
    else {
        cout.width(99-hand1.printHidden().size()); cout << left << "|" << right << hand1.printHidden() << " |" << endl;
    }
    cout << "|" << setw(100) << "hand |" << endl;
    cout.width(97-to_string(deck.size()/2).size()); cout << left << "|" << right << "[" << deck.size()/2 << "] |" << endl;
    cout << "|" << setw(100) << "deck |" << endl;
    cout << "[" << setw(50) << "player 1" << setw(50) << "]" << endl;
}